

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O2

String * Rct::backtrace(String *__return_storage_ptr__,int maxFrames)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  char *pcVar3;
  void *__ptr_00;
  char *__s;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  int status;
  ulong local_2840;
  undefined1 local_2838 [1024];
  char frame [1024];
  void *stack [1024];
  
  iVar1 = ::backtrace(stack,0x400);
  if (iVar1 < 1) {
    String::String(__return_storage_ptr__,"Couldn\'t get stack trace",0xffffffffffffffff);
  }
  else {
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    __ptr = (void *)backtrace_symbols(stack,iVar1);
    if (__ptr != (void *)0x0) {
      uVar4 = iVar1 - 1;
      if (uVar4 <= (uint)maxFrames) {
        maxFrames = uVar4;
      }
      local_2840 = (ulong)(maxFrames + 1);
      for (uVar6 = 1; local_2840 != uVar6; uVar6 = uVar6 + 1) {
        pcVar3 = *(char **)((long)__ptr + uVar6 * 8);
        if (pcVar3 == (char *)0x0) {
LAB_0017fb3d:
          __ptr_00 = (void *)0x0;
          pvVar5 = *(void **)((long)__ptr + uVar6 * 8);
        }
        else {
          pcVar2 = strchr(pcVar3,0x28);
          __s = pcVar2 + 1;
          if (pcVar2 == (char *)0x0) {
            __s = pcVar3;
          }
          pcVar3 = strchr(__s,0x2b);
          if (pcVar3 == (char *)0x0) {
            sVar7 = strlen(__s);
          }
          else {
            sVar7 = (long)pcVar3 - (long)__s;
          }
          if (0x3ff < sVar7) goto LAB_0017fb3d;
          memcpy(local_2838,__s,sVar7 + 1);
          local_2838[sVar7] = 0;
          __ptr_00 = (void *)__cxa_demangle(local_2838,0,0,&status);
          if (status != 0) {
            free(__ptr_00);
            goto LAB_0017fb3d;
          }
          pvVar5 = __ptr_00;
          if (__ptr_00 == (void *)0x0) goto LAB_0017fb3d;
        }
        snprintf(frame,0x400,"%d/%d %s\n",uVar6 & 0xffffffff,(ulong)uVar4,pvVar5);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String backtrace(int maxFrames)
{
    enum { SIZE = 1024 };
    void *stack[SIZE];

    const int frameCount = backtrace(stack, sizeof(stack) / sizeof(void*));
    if (frameCount <= 0)
        return String("Couldn't get stack trace");
    String ret;
    char **symbols = backtrace_symbols(stack, frameCount);
    if (symbols) {
        char frame[1024];
        for (int i=1; i<frameCount && (maxFrames < 0 || i - 1 < maxFrames); ++i) {
            char *demangled = demangle(symbols[i]);
            snprintf(frame, sizeof(frame), "%d/%d %s\n", i, frameCount - 1, demangled ? demangled : symbols[i]);
            ret += frame;
            if (demangled)
                free(demangled);
        }
        free(symbols);
    }
    return ret;
}